

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base32.cpp
# Opt level: O2

void __thiscall
Base32_UInt128MaxArray_Test::Base32_UInt128MaxArray_Test(Base32_UInt128MaxArray_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00252da0;
  return;
}

Assistant:

TEST (Base32, UInt128MaxArray) {
    using pstore::uint128;
    using pstore::base32::convert;
    uint128 v{std::array<std::uint8_t, 16>{{
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
    }}};
    EXPECT_EQ (convert (v), "7777777777777777777777777h");
}